

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O3

CURLcode Curl_readwrite(connectdata *conn,Curl_easy *data,_Bool *done,_Bool *comeback)

{
  size_t sVar1;
  int *piVar2;
  long *plVar3;
  char **ppcVar4;
  char cVar5;
  _func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *p_Var6;
  Curl_handler *pCVar7;
  void *pvVar8;
  curl_off_t *pcVar9;
  curl_off_t cVar10;
  long lVar11;
  _Bool _Var12;
  uint uVar13;
  CURLcode CVar14;
  CHUNKcode code;
  anon_enum_32 aVar15;
  int iVar16;
  time_t tVar17;
  char *pcVar18;
  size_t sVar19;
  byte bVar20;
  long lVar21;
  size_t sVar22;
  curl_socket_t writefd;
  uint uVar23;
  uint uVar24;
  curl_socket_t readfd0;
  uint uVar25;
  long lVar26;
  size_t sVar27;
  bool bVar28;
  timeval tVar29;
  ssize_t bytes_written;
  _Bool local_4d;
  _Bool readmore;
  _Bool *local_48;
  long local_40;
  _Bool *local_38;
  
  uVar23 = conn->cselect_bits;
  conn->cselect_bits = 0;
  uVar13 = (data->req).keepon;
  writefd = -1;
  readfd0 = -1;
  if ((uVar13 & 0x15) == 1) {
    readfd0 = conn->sockfd;
  }
  if ((uVar13 & 0x2a) == 2) {
    writefd = conn->writesockfd;
  }
  uVar23 = uVar23 | (conn->data->state).drain != 0;
  if (uVar23 == 0) {
    uVar23 = Curl_socket_check(readfd0,-1,writefd,0);
  }
  if (uVar23 == 4) {
    Curl_failf(data,"select/poll returned error");
    return CURLE_SEND_ERROR;
  }
  uVar13 = (data->req).keepon;
  uVar25 = 0;
  local_38 = comeback;
  if (((uVar13 & 1) != 0) &&
     (((uVar23 & 1) != 0 || (uVar25 = 0, (conn->bits).stream_was_rewound == true)))) {
    _readmore = _readmore & 0xffffff00;
    *done = false;
    *comeback = false;
    iVar16 = 100;
    uVar25 = 0;
    local_40 = 0;
    local_48 = done;
    do {
      sVar27 = (data->set).buffer_size;
      lVar21 = (data->req).size;
      if (((lVar21 != -1) && ((data->req).header == false)) &&
         (sVar22 = lVar21 - (data->req).bytecount, (long)sVar22 < (long)sVar27)) {
        sVar27 = sVar22;
      }
      if (sVar27 != 0) {
        CVar14 = Curl_read(conn,conn->sockfd,(data->req).buf,sVar27,&bytes_written);
        if (CVar14 == CURLE_OK) goto LAB_00504a35;
        if (CVar14 != CURLE_AGAIN) {
          return CVar14;
        }
LAB_00505083:
        if (0 < iVar16) goto LAB_0050509b;
        break;
      }
      bytes_written = 0;
LAB_00504a35:
      if ((((data->req).bytecount == 0) && ((data->req).writebytecount == 0)) &&
         (Curl_pgrsTime(data,TIMER_STARTTRANSFER), (data->req).exp100 != EXP100_SEND_DATA)) {
        tVar29 = curlx_tvnow();
        (data->req).start100 = tVar29;
      }
      if (bytes_written == 0) {
        bVar28 = (data->req).bodywrites == 0;
      }
      else {
        bVar28 = false;
      }
      if (bytes_written < 1 && !bVar28) {
        piVar2 = &(data->req).keepon;
        *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
LAB_0050507d:
        uVar25 = 1;
        goto LAB_00505083;
      }
      (data->req).buf[bytes_written] = '\0';
      (data->req).str = (data->req).buf;
      p_Var6 = conn->handler->readwrite;
      if (p_Var6 != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)0x0) {
        CVar14 = (*p_Var6)(data,conn,&bytes_written,&readmore);
        if (CVar14 != CURLE_OK) {
          return CVar14;
        }
        if (readmore != false) goto LAB_0050507d;
      }
      if ((data->req).header == true) {
        local_4d = false;
        CVar14 = Curl_http_readwrite_headers(data,conn,&bytes_written,&local_4d);
        if (CVar14 != CURLE_OK) {
          return CVar14;
        }
        p_Var6 = conn->handler->readwrite;
        if (((p_Var6 != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)0x0)
            && ((data->req).maxdownload < 1)) && (0 < bytes_written)) {
          CVar14 = (*p_Var6)(data,conn,&bytes_written,&readmore);
          if (CVar14 != CURLE_OK) {
            return CVar14;
          }
          if (readmore != false) goto LAB_0050507d;
        }
        if (local_4d == true) {
          if (0 < bytes_written) {
            _Var12 = Curl_pipeline_wanted(conn->data->multi,1);
            pcVar18 = (data->state).path;
            if (_Var12) {
              Curl_infof(data,"Rewinding stream by : %zd bytes on url %s (zero-length body)\n",
                         bytes_written,pcVar18);
              conn->read_pos = conn->read_pos - bytes_written;
              (conn->bits).stream_was_rewound = true;
            }
            else {
              Curl_infof(data,
                         "Excess found in a non pipelined read: excess = %zd url = %s (zero-length body)\n"
                         ,bytes_written,pcVar18);
            }
          }
          goto LAB_0050507d;
        }
      }
      if ((((data->req).str != (char *)0x0) && ((data->req).header == false)) &&
         (0 < bytes_written || bVar28)) {
        if ((data->set).opt_no_body == true) {
          Curl_conncontrol(conn,2);
          *local_48 = true;
          return CURLE_WEIRD_SERVER_REPLY;
        }
        if (((data->req).bodywrites == 0 && !bVar28) && ((conn->handler->protocol & 0x40003) != 0))
        {
          if ((data->req).newurl != (char *)0x0) {
            if ((conn->bits).close == true) {
              piVar2 = &(data->req).keepon;
              *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
              *local_48 = true;
              uVar25 = 1;
              done = local_48;
              goto LAB_005050d7;
            }
            (data->req).ignorebody = true;
            Curl_infof(data,"Ignoring the response-body\n");
          }
          lVar21 = (data->state).resume_from;
          if (((lVar21 != 0) && ((data->req).content_range == false)) &&
             (((data->set).httpreq == HTTPREQ_GET && ((data->req).ignorebody == false)))) {
            if ((data->req).size != lVar21) {
              Curl_failf(data,"HTTP server doesn\'t seem to support byte ranges. Cannot resume.");
              return CURLE_RANGE_ERROR;
            }
            Curl_infof(data,"The entire document is already downloaded");
            uVar25 = 1;
            Curl_conncontrol(conn,1);
            piVar2 = &(data->req).keepon;
            *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
            *local_48 = true;
            done = local_48;
            goto LAB_005050d7;
          }
          if ((((data->set).timecondition != CURL_TIMECOND_NONE) &&
              ((data->state).range == (char *)0x0)) &&
             (_Var12 = Curl_meets_timecondition(data,(data->req).timeofdoc), done = local_48,
             !_Var12)) {
            *local_48 = true;
            (data->info).httpcode = 0x130;
            Curl_infof(data,"Simulate a HTTP 304 response!\n");
            uVar25 = 1;
            Curl_conncontrol(conn,1);
            goto LAB_005050d7;
          }
        }
        plVar3 = &(data->req).bodywrites;
        *plVar3 = *plVar3 + 1;
        if (((data->set).verbose == true) &&
           (((data->req).badheader == HEADER_NORMAL ||
            (Curl_debug(data,CURLINFO_DATA_IN,(data->state).headerbuff,(data->req).hbuflen,conn),
            (data->req).badheader == HEADER_PARTHEADER)))) {
          Curl_debug(data,CURLINFO_DATA_IN,(data->req).str,bytes_written,conn);
        }
        if ((data->req).chunk == true) {
          code = Curl_httpchunk_read(conn,(data->req).str,bytes_written,&bytes_written);
          if (CHUNKE_OK < code) {
            if (code != CHUNKE_WRITE_ERROR) {
              pcVar18 = Curl_chunked_strerror(code);
              Curl_failf(data,"%s in chunked-encoding",pcVar18);
              return CURLE_RECV_ERROR;
            }
            Curl_failf(data,"Failed writing data");
            return CURLE_WRITE_ERROR;
          }
          if (code == CHUNKE_STOP) {
            piVar2 = &(data->req).keepon;
            *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
            sVar27 = (conn->chunk).dataleft;
            if (sVar27 != 0) {
              Curl_infof(conn->data,"Leftovers after chunking: %zu bytes\n",sVar27);
              _Var12 = Curl_pipeline_wanted(conn->data->multi,1);
              if (_Var12) {
                Curl_infof(conn->data,"Rewinding %zu bytes\n",sVar27);
                conn->read_pos = conn->read_pos - sVar27;
                (conn->bits).stream_was_rewound = true;
              }
            }
          }
        }
        if ((data->req).badheader == HEADER_NORMAL) {
          lVar21 = (data->req).bytecount;
        }
        else {
          lVar21 = (data->req).bytecount;
          if ((data->req).ignorebody == false) {
            lVar21 = lVar21 + (data->req).hbuflen;
            (data->req).bytecount = lVar21;
          }
        }
        lVar11 = (data->req).maxdownload;
        if (lVar11 != -1) {
          lVar26 = (bytes_written + lVar21) - lVar11;
          if (lVar11 <= bytes_written + lVar21) {
            if ((lVar26 != 0) && ((data->req).ignorebody == false)) {
              _Var12 = Curl_pipeline_wanted(conn->data->multi,1);
              if (_Var12) {
                Curl_infof(data,
                           "Rewinding stream by : %zu bytes on url %s (size = %ld, maxdownload = %ld, bytecount = %ld, nread = %zd)\n"
                           ,lVar26,(data->state).path,(data->req).size,(data->req).maxdownload,
                           (data->req).bytecount,bytes_written);
                conn->read_pos = conn->read_pos - lVar26;
                (conn->bits).stream_was_rewound = true;
              }
              else {
                Curl_infof(data,
                           "Excess found in a non pipelined read: excess = %zu, size = %ld, maxdownload = %ld, bytecount = %ld\n"
                           ,lVar26,(data->req).size,(data->req).maxdownload,(data->req).bytecount);
              }
            }
            lVar21 = (data->req).bytecount;
            bytes_written = (data->req).maxdownload - lVar21;
            if (bytes_written < 1) {
              bytes_written = 0;
            }
            piVar2 = &(data->req).keepon;
            *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
            local_40 = lVar26;
          }
        }
        (data->req).bytecount = lVar21 + bytes_written;
        Curl_pgrsSetDownloadCounter(data,lVar21 + bytes_written);
        if (((data->req).chunk == false) &&
           (aVar15 = (data->req).badheader,
           (aVar15 != HEADER_NORMAL || bytes_written != 0) || bVar28)) {
          bVar20 = (data->req).ignorebody;
          if (aVar15 == HEADER_NORMAL) {
LAB_00504f00:
            if ((bVar20 & 1) == 0) {
              CVar14 = Curl_client_write(conn,1,(data->req).str,bytes_written);
              (data->req).badheader = HEADER_NORMAL;
              if (CVar14 != CURLE_OK) {
                return CVar14;
              }
              goto LAB_00504f3b;
            }
          }
          else {
            if ((bVar20 & 1) == 0) {
              sVar27 = (data->req).maxdownload;
              sVar22 = (data->req).hbuflen;
              sVar19 = sVar27;
              if ((long)sVar22 < (long)sVar27) {
                sVar19 = sVar22;
              }
              if (sVar27 == 0xffffffffffffffff) {
                sVar19 = sVar22;
              }
              CVar14 = Curl_client_write(conn,1,(data->state).headerbuff,sVar19);
              if (CVar14 != CURLE_OK) {
                return CVar14;
              }
              aVar15 = (data->req).badheader;
            }
            if (aVar15 < HEADER_ALLBAD) {
              bVar20 = (data->req).ignorebody;
              goto LAB_00504f00;
            }
          }
          (data->req).badheader = HEADER_NORMAL;
        }
      }
LAB_00504f3b:
      pCVar7 = conn->handler;
      p_Var6 = pCVar7->readwrite;
      if (((p_Var6 != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)0x0) &&
          (local_40 != 0)) && ((conn->bits).stream_was_rewound == false)) {
        ppcVar4 = &(data->req).str;
        *ppcVar4 = *ppcVar4 + bytes_written;
        bytes_written = local_40;
        CVar14 = (*p_Var6)(data,conn,&bytes_written,&readmore);
        if (CVar14 != CURLE_OK) {
          return CVar14;
        }
        uVar25 = 1;
        if (readmore == true) {
          piVar2 = &(data->req).keepon;
          *(byte *)piVar2 = (byte)*piVar2 | 1;
        }
        goto LAB_00505083;
      }
      if (bVar28) {
        piVar2 = &(data->req).keepon;
        *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
      }
      if (((pCVar7->protocol & 0x30) == 0) && (_Var12 = Curl_ssl_data_pending(conn,0), !_Var12))
      goto LAB_0050507d;
      uVar25 = 1;
      bVar28 = iVar16 != 0;
      iVar16 = iVar16 + -1;
    } while (bVar28);
    conn->cselect_bits = 1;
    *local_38 = true;
LAB_0050509b:
    done = local_48;
    if ((((data->req).keepon & 3U) == 2) && ((conn->bits).close == true)) {
      Curl_infof(data,"we are done reading and this is set to close, stop send\n");
      piVar2 = &(data->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
    }
LAB_005050d7:
    if (*done != false) {
      return CURLE_OK;
    }
    uVar13 = (data->req).keepon;
  }
  uVar24 = uVar25;
  if ((uVar23 & uVar13 & 2) == 0) goto LAB_0050510f;
  if (((data->req).bytecount == 0) && ((data->req).writebytecount == 0)) {
    Curl_pgrsTime(data,TIMER_STARTTRANSFER);
  }
  uVar24 = uVar25 | 2;
  sVar27 = (data->req).upload_present;
  if (sVar27 != 0) {
LAB_005048bd:
    CVar14 = Curl_write(conn,conn->writesockfd,(data->req).upload_fromhere,sVar27,&bytes_written);
    if (CVar14 != CURLE_OK) {
      return CVar14;
    }
    if ((data->set).verbose == true) {
      Curl_debug(data,CURLINFO_DATA_OUT,(data->req).upload_fromhere,bytes_written,conn);
    }
    lVar21 = (data->req).writebytecount + bytes_written;
    (data->req).writebytecount = lVar21;
    if (lVar21 == (data->state).infilesize) {
      (data->req).upload_done = true;
      Curl_infof(data,"We are completely uploaded and fine\n");
    }
    lVar21 = (data->req).upload_present - bytes_written;
    if (lVar21 == 0) {
      (data->req).upload_fromhere = (data->state).uploadbuffer;
      (data->req).upload_present = 0;
      if ((((data->req).upload_done == true) &&
          (piVar2 = &(data->req).keepon, *(byte *)piVar2 = (byte)*piVar2 & 0xfd,
          (conn->bits).rewindaftersend == true)) &&
         (CVar14 = Curl_readrewind(conn), CVar14 != CURLE_OK)) {
        return CVar14;
      }
    }
    else {
      (data->req).upload_present = lVar21;
      ppcVar4 = &(data->req).upload_fromhere;
      *ppcVar4 = *ppcVar4 + bytes_written;
    }
    Curl_pgrsSetUploadCounter(data,(data->req).writebytecount);
    goto LAB_0050510f;
  }
  (data->req).upload_fromhere = (data->state).uploadbuffer;
  if ((data->req).upload_done == false) {
    pvVar8 = (data->req).protop;
    if (((data->req).exp100 == EXP100_SENDING_REQUEST) && (*(int *)((long)pvVar8 + 0x78) == 2)) {
      (data->req).exp100 = EXP100_AWAITING_CONTINUE;
      piVar2 = &(data->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
      tVar29 = curlx_tvnow();
      (data->req).start100 = tVar29;
      Curl_expire(data,(data->set).expect_100_timeout,EXPIRE_100_TIMEOUT);
      uVar24 = uVar25;
      goto LAB_0050510f;
    }
    if ((conn->handler->protocol & 0x40003) == 0) {
      bVar28 = false;
    }
    else {
      bVar28 = *(int *)((long)pvVar8 + 0x78) == 1;
    }
    CVar14 = Curl_fillreadbuffer(conn,0x4000,(int *)&readmore);
    if (CVar14 != CURLE_OK) {
      return CVar14;
    }
    sVar27 = (size_t)(int)_readmore;
    if (sVar27 == 0) goto LAB_00504fb4;
    if (0 < (int)_readmore) {
      (data->req).upload_present = sVar27;
      if ((!bVar28) && (((data->set).prefer_ascii != false || ((data->set).crlf == true)))) {
        if ((data->state).scratch == (char *)0x0) {
          pcVar18 = (char *)(*Curl_cmalloc)((data->set).buffer_size * 2);
          (data->state).scratch = pcVar18;
          if (pcVar18 == (char *)0x0) {
            Curl_failf(data,"Failed to alloc scratch buffer!");
            return CURLE_OUT_OF_MEMORY;
          }
        }
        sVar19 = 0;
        sVar22 = 0;
        do {
          cVar5 = (data->req).upload_fromhere[sVar19];
          pcVar18 = (data->state).scratch;
          if (cVar5 == '\n') {
            sVar1 = sVar22 + 1;
            pcVar18[sVar22] = '\r';
            (data->state).scratch[sVar22 + 1] = '\n';
            sVar22 = sVar1;
            if (((data->set).crlf == false) && (lVar21 = (data->state).infilesize, lVar21 != -1)) {
              (data->state).infilesize = lVar21 + 1;
            }
          }
          else {
            pcVar18[sVar22] = cVar5;
          }
          sVar19 = sVar19 + 1;
          sVar22 = sVar22 + 1;
        } while (sVar27 != sVar19);
        if (sVar22 == sVar27) {
          sVar27 = (data->req).upload_present;
        }
        else {
          (data->req).upload_fromhere = (data->state).scratch;
          (data->req).upload_present = sVar22;
          sVar27 = sVar22;
        }
      }
      goto LAB_005048bd;
    }
    uVar23 = (data->req).keepon;
  }
  else {
LAB_00504fb4:
    uVar23 = (data->req).keepon;
    if ((uVar23 & 0x20) != 0) goto LAB_0050510f;
  }
  (data->req).keepon = uVar23 & 0xfffffffd;
  if (((conn->bits).rewindaftersend == true) && (CVar14 = Curl_readrewind(conn), CVar14 != CURLE_OK)
     ) {
    return CVar14;
  }
LAB_0050510f:
  tVar29 = curlx_tvnow();
  (data->req).now = tVar29;
  if (uVar24 == 0) {
    if (((data->req).exp100 == EXP100_AWAITING_CONTINUE) &&
       (tVar17 = curlx_tvdiff(tVar29,(data->req).start100), (data->set).expect_100_timeout <= tVar17
       )) {
      (data->req).exp100 = EXP100_SEND_DATA;
      piVar2 = &(data->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 | 2;
      Curl_expire_done(data,EXPIRE_100_TIMEOUT);
      Curl_infof(data,"Done waiting for 100-continue\n");
    }
  }
  else {
    pcVar9 = (data->req).bytecountp;
    if (pcVar9 != (curl_off_t *)0x0) {
      *pcVar9 = (data->req).bytecount;
    }
    pcVar9 = (data->req).writebytecountp;
    if (pcVar9 != (curl_off_t *)0x0) {
      *pcVar9 = (data->req).writebytecount;
    }
  }
  iVar16 = Curl_pgrsUpdate(conn);
  if (iVar16 == 0) {
    CVar14 = Curl_speedcheck(data,(data->req).now);
    if (CVar14 != CURLE_OK) {
      return CVar14;
    }
    if ((data->req).keepon == 0) {
      if ((data->set).opt_no_body == false) {
        lVar21 = (data->req).size;
        if (((lVar21 != -1) && (lVar11 = (data->req).bytecount, lVar21 != lVar11)) &&
           ((lVar11 != lVar21 + (data->state).crlf_conversions &&
            ((data->req).newurl == (char *)0x0)))) {
          Curl_failf(data,"transfer closed with %ld bytes remaining to read");
          return CURLE_PARTIAL_FILE;
        }
        if (((data->req).chunk == true) && ((conn->chunk).state != CHUNK_STOP)) {
          Curl_failf(data,"transfer closed with outstanding read data remaining");
          return CURLE_PARTIAL_FILE;
        }
      }
      iVar16 = Curl_pgrsUpdate(conn);
      if (iVar16 != 0) {
        return CURLE_ABORTED_BY_CALLBACK;
      }
    }
    else {
      tVar17 = Curl_timeleft(data,&(data->req).now,false);
      if (tVar17 < 0) {
        lVar21 = (data->req).size;
        tVar17 = curlx_tvdiff((data->req).now,(data->progress).t_startsingle);
        cVar10 = (data->req).bytecount;
        if (lVar21 == -1) {
          Curl_failf(data,"Operation timed out after %ld milliseconds with %ld bytes received",
                     tVar17,cVar10);
        }
        else {
          Curl_failf(data,
                     "Operation timed out after %ld milliseconds with %ld out of %ld bytes received"
                     ,tVar17,cVar10,(data->req).size);
        }
        return CURLE_OPERATION_TIMEDOUT;
      }
    }
    *done = ((data->req).keepon & 0x33) == 0;
    return CURLE_OK;
  }
  return CURLE_ABORTED_BY_CALLBACK;
}

Assistant:

CURLcode Curl_readwrite(struct connectdata *conn,
                        struct Curl_easy *data,
                        bool *done,
                        bool *comeback)
{
  struct SingleRequest *k = &data->req;
  CURLcode result;
  int didwhat=0;

  curl_socket_t fd_read;
  curl_socket_t fd_write;
  int select_res = conn->cselect_bits;

  conn->cselect_bits = 0;

  /* only use the proper socket if the *_HOLD bit is not set simultaneously as
     then we are in rate limiting state in that transfer direction */

  if((k->keepon & KEEP_RECVBITS) == KEEP_RECV)
    fd_read = conn->sockfd;
  else
    fd_read = CURL_SOCKET_BAD;

  if((k->keepon & KEEP_SENDBITS) == KEEP_SEND)
    fd_write = conn->writesockfd;
  else
    fd_write = CURL_SOCKET_BAD;

  if(conn->data->state.drain) {
    select_res |= CURL_CSELECT_IN;
    DEBUGF(infof(data, "Curl_readwrite: forcibly told to drain data\n"));
  }

  if(!select_res) /* Call for select()/poll() only, if read/write/error
                     status is not known. */
    select_res = Curl_socket_check(fd_read, CURL_SOCKET_BAD, fd_write, 0);

  if(select_res == CURL_CSELECT_ERR) {
    failf(data, "select/poll returned error");
    return CURLE_SEND_ERROR;
  }

  /* We go ahead and do a read if we have a readable socket or if
     the stream was rewound (in which case we have data in a
     buffer) */
  if((k->keepon & KEEP_RECV) &&
     ((select_res & CURL_CSELECT_IN) || conn->bits.stream_was_rewound)) {

    result = readwrite_data(data, conn, k, &didwhat, done, comeback);
    if(result || *done)
      return result;
  }

  /* If we still have writing to do, we check if we have a writable socket. */
  if((k->keepon & KEEP_SEND) && (select_res & CURL_CSELECT_OUT)) {
    /* write */

    result = readwrite_upload(data, conn, &didwhat);
    if(result)
      return result;
  }

  k->now = Curl_tvnow();
  if(didwhat) {
    /* Update read/write counters */
    if(k->bytecountp)
      *k->bytecountp = k->bytecount; /* read count */
    if(k->writebytecountp)
      *k->writebytecountp = k->writebytecount; /* write count */
  }
  else {
    /* no read no write, this is a timeout? */
    if(k->exp100 == EXP100_AWAITING_CONTINUE) {
      /* This should allow some time for the header to arrive, but only a
         very short time as otherwise it'll be too much wasted time too
         often. */

      /* Quoting RFC2616, section "8.2.3 Use of the 100 (Continue) Status":

         Therefore, when a client sends this header field to an origin server
         (possibly via a proxy) from which it has never seen a 100 (Continue)
         status, the client SHOULD NOT wait for an indefinite period before
         sending the request body.

      */

      time_t ms = Curl_tvdiff(k->now, k->start100);
      if(ms >= data->set.expect_100_timeout) {
        /* we've waited long enough, continue anyway */
        k->exp100 = EXP100_SEND_DATA;
        k->keepon |= KEEP_SEND;
        Curl_expire_done(data, EXPIRE_100_TIMEOUT);
        infof(data, "Done waiting for 100-continue\n");
      }
    }
  }

  if(Curl_pgrsUpdate(conn))
    result = CURLE_ABORTED_BY_CALLBACK;
  else
    result = Curl_speedcheck(data, k->now);
  if(result)
    return result;

  if(k->keepon) {
    if(0 > Curl_timeleft(data, &k->now, FALSE)) {
      if(k->size != -1) {
        failf(data, "Operation timed out after %ld milliseconds with %"
              CURL_FORMAT_CURL_OFF_T " out of %"
              CURL_FORMAT_CURL_OFF_T " bytes received",
              Curl_tvdiff(k->now, data->progress.t_startsingle), k->bytecount,
              k->size);
      }
      else {
        failf(data, "Operation timed out after %ld milliseconds with %"
              CURL_FORMAT_CURL_OFF_T " bytes received",
              Curl_tvdiff(k->now, data->progress.t_startsingle), k->bytecount);
      }
      return CURLE_OPERATION_TIMEDOUT;
    }
  }
  else {
    /*
     * The transfer has been performed. Just make some general checks before
     * returning.
     */

    if(!(data->set.opt_no_body) && (k->size != -1) &&
       (k->bytecount != k->size) &&
#ifdef CURL_DO_LINEEND_CONV
       /* Most FTP servers don't adjust their file SIZE response for CRLFs,
          so we'll check to see if the discrepancy can be explained
          by the number of CRLFs we've changed to LFs.
       */
       (k->bytecount != (k->size + data->state.crlf_conversions)) &&
#endif /* CURL_DO_LINEEND_CONV */
       !k->newurl) {
      failf(data, "transfer closed with %" CURL_FORMAT_CURL_OFF_T
            " bytes remaining to read", k->size - k->bytecount);
      return CURLE_PARTIAL_FILE;
    }
    if(!(data->set.opt_no_body) && k->chunk &&
       (conn->chunk.state != CHUNK_STOP)) {
      /*
       * In chunked mode, return an error if the connection is closed prior to
       * the empty (terminating) chunk is read.
       *
       * The condition above used to check for
       * conn->proto.http->chunk.datasize != 0 which is true after reading
       * *any* chunk, not just the empty chunk.
       *
       */
      failf(data, "transfer closed with outstanding read data remaining");
      return CURLE_PARTIAL_FILE;
    }
    if(Curl_pgrsUpdate(conn))
      return CURLE_ABORTED_BY_CALLBACK;
  }

  /* Now update the "done" boolean we return */
  *done = (0 == (k->keepon&(KEEP_RECV|KEEP_SEND|
                            KEEP_RECV_PAUSE|KEEP_SEND_PAUSE))) ? TRUE : FALSE;

  return CURLE_OK;
}